

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::
join<char_const(&)[18],unsigned_int&,char_const(&)[15],unsigned_int&,char_const(&)[15],unsigned_int&,char_const(&)[4]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [18],uint *ts_1,
          char (*ts_2) [15],uint *ts_3,char (*ts_4) [15],uint *ts_5,char (*ts_6) [4])

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> local_1120;
  
  StringStream<4096UL,_4096UL>::StringStream(&local_1120);
  inner::
  join_helper<char_const(&)[18],unsigned_int&,char_const(&)[15],unsigned_int&,char_const(&)[15],unsigned_int&,char_const(&)[4]>
            (&local_1120,(char (*) [18])this,(uint *)ts,(char (*) [15])ts_1,(uint *)ts_2,
             (char (*) [15])ts_3,(uint *)ts_4,(char (*) [4])ts_5);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&local_1120);
  StringStream<4096UL,_4096UL>::~StringStream(&local_1120);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}